

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall BenevolentBotStrategy::intInput(BenevolentBotStrategy *this,StrategyContext context)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  pointer pCVar2;
  int iVar3;
  int iVar4;
  pointer pCVar5;
  long *plVar6;
  
  iVar3 = -1;
  switch(context) {
  case DEFEND_DICE_COUNT:
    iVar3 = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    break;
  case FORTIFY_FROM_COUNTRY:
    iVar3 = fortifyFromCountryIndex(this);
    break;
  case FORTIFY_TO_COUNTRY:
    iVar3 = fortifyToCountryIndex(this);
    break;
  case FORTIFY_ARMY_COUNT:
    iVar4 = *((this->super_PlayerStrategy).from)->pNumberOfTroops -
            *((this->super_PlayerStrategy).to)->pNumberOfTroops;
    iVar3 = 0;
    if (-2 < iVar4) {
      iVar3 = iVar4 / 2;
    }
    break;
  case REINFORCE_CARD_COUNT:
    pvVar1 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
    pCVar5 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar2 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar5 == pCVar2) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)(*pCVar5 == *(this->super_PlayerStrategy).exchangingCardType);
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != pCVar2);
    }
    break;
  case REINFORCE_ARMY_COUNT:
    iVar3 = place(this);
  }
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  return iVar3;
}

Assistant:

int BenevolentBotStrategy::intInput(StrategyContext context) {
    int count = 0;

    switch ((int) context) {
        case StrategyContext::DEFEND_DICE_COUNT:
            count = defendNumDice();
            break;
        case StrategyContext::FORTIFY_FROM_COUNTRY:
            count = fortifyFromCountryIndex();
            break;
        case StrategyContext::FORTIFY_TO_COUNTRY:
            count = fortifyToCountryIndex();
            break;
        case StrategyContext::FORTIFY_ARMY_COUNT:
            count = fortifyArmyCount();
            break;
        case StrategyContext::REINFORCE_ARMY_COUNT:
            count = place();
            break;
        case StrategyContext::REINFORCE_CARD_COUNT:
            count = numArmies();
            break;
        case StrategyContext::ATTACK_FROM_COUNTRY:
        case StrategyContext::ATTACK_TO_COUNTRY:
        case StrategyContext::ATTACK_DICE_COUNT:
        case StrategyContext::ATTACK_NEW_ARMY_COUNT:
        default: {
            count = -1;
        }
    }
    std::cout << count << std::endl;
    return count;
}